

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miam.c
# Opt level: O1

void la_miam_file_transfer_abort_format_text(la_vstring *vstr,void *data,int indent)

{
  char *pcVar1;
  char *pcVar2;
  
  la_vstring_append_sprintf(vstr,"%*sFile ID: %u\n",(ulong)(indent + 1U),"",(ulong)*data);
  pcVar1 = (char *)la_dict_search(la_miam_file_transfer_abort_format_text::abort_reasons,
                                  (uint)*(ushort *)((long)data + 2));
  pcVar2 = "unknown";
  if (pcVar1 != (char *)0x0) {
    pcVar2 = pcVar1;
  }
  la_vstring_append_sprintf
            (vstr,"%*sReason: %u (%s)\n",(ulong)(indent + 1U),"",(ulong)*(ushort *)((long)data + 2),
             pcVar2);
  return;
}

Assistant:

static void la_miam_file_transfer_abort_format_text(la_vstring *vstr, void const *data, int indent) {
	static la_dict const abort_reasons[] = {
		{ .id = 0, .val = "File transfer request refused by receiver" },
		{ .id = 1, .val = "File segment out of context" },
		{ .id = 2, .val = "File transfer stopped by sender" },
		{ .id = 3, .val = "File transfer stopped by receiver" },
		{ .id = 4, .val = "File segment transmission failed" },
		{ .id = 0, .val = NULL }
	};
	la_assert(vstr);
	la_assert(data);
	la_assert(indent >= 0);

	la_miam_file_transfer_abort_msg const *msg = data;
	indent++;
	LA_ISPRINTF(vstr, indent, "File ID: %u\n", msg->file_id);
	char *descr = la_dict_search(abort_reasons, msg->reason);
	LA_ISPRINTF(vstr, indent, "Reason: %u (%s)\n", msg->reason,
			(descr != NULL ? descr : "unknown"));
}